

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

void compress_view(uint8_t *dst,picnic_instance_t *pp,view_t *views,uint idx)

{
  ushort uVar1;
  ulong uVar2;
  sbyte sVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint skip_bits;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  
  bVar5 = (pp->lowmc).m;
  uVar9 = (uint)(pp->lowmc).r;
  if ((ulong)bVar5 == 10) {
    if (uVar9 != 0) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar15 = views->t[idx];
        pbVar13 = dst + (uVar12 >> 3);
        uVar14 = uVar15 >> 0x22;
        uVar6 = (uint)uVar12 & 6;
        if ((uVar12 & 6) == 0) {
          uVar8 = 0x1e;
        }
        else {
          uVar8 = (ulong)(uVar6 + 0x16);
          *pbVar13 = (byte)(uVar14 >> uVar8) |
                     (byte)(0xff << ((byte)(8 - (char)uVar6) & 0x1f)) & *pbVar13;
          pbVar13 = pbVar13 + 1;
        }
        uVar12 = uVar12 + 0x1e;
        do {
          uVar8 = uVar8 - 8;
          *pbVar13 = (byte)(uVar14 >> (uVar8 & 0x3f));
          pbVar13 = pbVar13 + 1;
        } while (7 < uVar8);
        if (uVar8 != 0) {
          bVar5 = (byte)uVar8;
          sVar3 = (bVar5 < 0x21) * (' ' - bVar5);
          *pbVar13 = (char)(((uint)(uVar15 >> 0x22) << sVar3) >> sVar3) <<
                     ((ulong)(byte)(8 - bVar5) & 0x3f) |
                     (byte)(0xff >> ((uint)uVar8 & 0x1f)) & *pbVar13;
        }
        uVar10 = uVar10 + 1;
        views = views + 1;
      } while (uVar10 != uVar9);
    }
  }
  else if (uVar9 != 0) {
    uVar10 = 0;
    uVar15 = 0;
    uVar12 = (ulong)bVar5 * 3;
    uVar1 = (pp->lowmc).n;
    do {
      puVar19 = (ulong *)((long)views + ((ulong)(uVar1 + 0x3f >> 6) - 1) * 8 + (ulong)idx * 0x20);
      uVar14 = uVar12;
      if (0x15 < bVar5) {
        uVar8 = uVar15 & 7;
        uVar6 = (uint)uVar15 & 7;
        uVar18 = (ulong)(uVar6 + 0x38);
        do {
          uVar2 = *puVar19;
          pbVar13 = dst + (uVar15 >> 3);
          if (uVar8 == 0) {
            uVar17 = 0x40;
          }
          else {
            *pbVar13 = (byte)(uVar2 >> (uVar18 & 0x3f)) |
                       *pbVar13 & (byte)(0xff << ((byte)(8 - (char)uVar6) & 0x1f));
            pbVar13 = pbVar13 + 1;
            uVar17 = uVar18;
          }
          uVar15 = uVar15 + 0x40;
          do {
            uVar17 = uVar17 - 8;
            *pbVar13 = (byte)(uVar2 >> (uVar17 & 0x3f));
            pbVar13 = pbVar13 + 1;
          } while (7 < uVar17);
          if (uVar17 != 0) {
            bVar16 = (byte)uVar17;
            sVar3 = (bVar16 < 0x21) * (' ' - bVar16);
            *pbVar13 = (char)((uint)((int)uVar2 << sVar3) >> sVar3) <<
                       ((ulong)(byte)(8 - bVar16) & 0x3f) |
                       (byte)(0xff >> ((uint)uVar17 & 0x1f)) & *pbVar13;
          }
          uVar14 = uVar14 - 0x40;
          puVar19 = puVar19 + -1;
        } while (0x3f < uVar14);
      }
      if (uVar14 != 0) {
        uVar7 = (uint)uVar14;
        uVar8 = *puVar19 >> ((ulong)(byte)-(char)uVar14 & 0x3f);
        pbVar13 = dst + (uVar15 >> 3);
        uVar6 = (uint)uVar15 & 7;
        if ((uVar15 & 7) == 0) {
          uVar18 = uVar14 & 0xffffffff;
        }
        else {
          uVar4 = 8 - uVar6;
          uVar11 = uVar7;
          if (uVar4 < uVar7) {
            uVar11 = uVar4;
          }
          uVar18 = (ulong)(uVar7 - uVar11);
          *pbVar13 = (byte)((uVar8 >> (uVar18 & 0x3f)) << ((ulong)(uVar4 - uVar11) & 0x3f)) |
                     ((byte)(0xff >> (uVar6 + uVar11 & 0x1f)) | (byte)(0xff << (uVar4 & 0x1f))) &
                     *pbVar13;
          pbVar13 = pbVar13 + 1;
        }
        if (7 < (uint)uVar18) {
          do {
            uVar18 = uVar18 - 8;
            *pbVar13 = (byte)(uVar8 >> (uVar18 & 0x3f));
            pbVar13 = pbVar13 + 1;
          } while (7 < uVar18);
        }
        uVar15 = uVar14 + uVar15;
        if ((uint)uVar18 != 0) {
          bVar16 = (byte)uVar18;
          sVar3 = (bVar16 < 0x21) * (' ' - bVar16);
          *pbVar13 = (char)((uint)((int)uVar8 << sVar3) >> sVar3) <<
                     ((ulong)(byte)(8 - bVar16) & 0x3f) |
                     (byte)(0xff >> ((uint)uVar18 & 0x1f)) & *pbVar13;
        }
      }
      uVar10 = uVar10 + 1;
      views = views + 1;
    } while (uVar10 != uVar9);
  }
  return;
}

Assistant:

static void compress_view(uint8_t* dst, const picnic_instance_t* pp, const view_t* views,
                          const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.w = dst;
  bs.position = 0;

  const view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_to_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      uint64_to_bitstream_10(&bs, v->t[idx]);
    }
    return;
  }
#endif
  UNREACHABLE;
}